

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::deleteCols(Highs *this,HighsInt num_set_entries,HighsInt *set)

{
  HighsInt create_error_00;
  int in_ESI;
  HighsIndexCollection *in_RDI;
  HighsInt create_error;
  HighsIndexCollection index_collection;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  Highs *in_stack_fffffffffffffec0;
  allocator *set_00;
  HighsInt num_set_entries_00;
  undefined1 in_stack_fffffffffffffee3;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  string local_108 [8];
  HighsInt in_stack_ffffffffffffff00;
  HighsInt in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  HighsStatus in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  HighsInt in_stack_ffffffffffffff14;
  HighsIndexCollection *in_stack_ffffffffffffff18;
  undefined1 local_70 [108];
  HighsStatus local_4;
  
  if (in_ESI == 0) {
    local_4 = kOk;
  }
  else {
    clearDerivedModelProperties(in_stack_fffffffffffffec0);
    num_set_entries_00 = (HighsInt)((ulong)local_70 >> 0x20);
    HighsIndexCollection::HighsIndexCollection((HighsIndexCollection *)in_stack_fffffffffffffec0);
    create_error_00 =
         create(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,
                (HighsInt *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                in_stack_ffffffffffffff04);
    if (create_error_00 == 0) {
      deleteColsInterface((Highs *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                          in_RDI);
      local_4 = returnFromHighs((Highs *)CONCAT44(in_stack_ffffffffffffff14,
                                                  in_stack_ffffffffffffff10),
                                in_stack_ffffffffffffff0c);
    }
    else {
      HighsLogOptions::HighsLogOptions
                ((HighsLogOptions *)in_stack_fffffffffffffec0,
                 (HighsLogOptions *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      set_00 = (allocator *)&stack0xfffffffffffffef7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_108,"deleteCols",set_00);
      local_4 = analyseSetCreateError
                          ((HighsLogOptions *)
                           CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                           (string *)in_RDI,create_error_00,(bool)in_stack_fffffffffffffee3,
                           num_set_entries_00,(HighsInt *)set_00,in_stack_ffffffffffffff00);
      std::__cxx11::string::~string(local_108);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffef7);
      HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x49729a);
    }
    HighsIndexCollection::~HighsIndexCollection((HighsIndexCollection *)in_stack_fffffffffffffec0);
  }
  return local_4;
}

Assistant:

HighsStatus Highs::deleteCols(const HighsInt num_set_entries,
                              const HighsInt* set) {
  if (num_set_entries == 0) return HighsStatus::kOk;
  clearDerivedModelProperties();
  HighsIndexCollection index_collection;
  const HighsInt create_error =
      create(index_collection, num_set_entries, set, model_.lp_.num_col_);
  if (create_error)
    return analyseSetCreateError(options_.log_options, "deleteCols",
                                 create_error, false, num_set_entries, set,
                                 model_.lp_.num_col_);
  deleteColsInterface(index_collection);
  return returnFromHighs(HighsStatus::kOk);
}